

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointgrid.cpp
# Opt level: O3

bool __thiscall ON_PointGrid::Transform(ON_PointGrid *this,ON_Xform *xform)

{
  int point_count0;
  int point_count1;
  int iVar1;
  bool bVar2;
  ON_3dPoint *pOVar3;
  double *point;
  ON_3dPoint *this_00;
  
  ON_Object::TransformUserData((ON_Object *)this,xform);
  point_count0 = this->m_point_count[0];
  point_count1 = this->m_point_count[1];
  iVar1 = this->m_point_stride0;
  pOVar3 = &m_no_point;
  if (0 < point_count1) {
    pOVar3 = (this->m_point).super_ON_SimpleArray<ON_3dPoint>.m_a;
  }
  this_00 = &m_no_point;
  if (0 < point_count0) {
    this_00 = pOVar3;
  }
  point = ON_3dPoint::operator_cast_to_double_(this_00);
  bVar2 = ON_TransformPointGrid(3,false,point_count0,point_count1,iVar1 * 3,3,point,xform);
  return bVar2;
}

Assistant:

bool ON_PointGrid::Transform( const ON_Xform& xform )
{
  TransformUserData(xform);
  return ON_TransformPointGrid( 3, false, 
            m_point_count[0], m_point_count[1],
            m_point_stride0*3, 3,
            Point(0,0), 
            xform );
}